

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_file_open_append(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar5;
  undefined1 *__s1;
  undefined8 uVar6;
  __off64_t _Var7;
  void *pvVar8;
  void *pvVar9;
  char *pcVar10;
  uv_fs_t *puVar11;
  int in_EDI;
  undefined1 *puVar12;
  long unaff_R12;
  char *pcVar13;
  uv_fs_t *unaff_R14;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uv_buf_t uVar19;
  undefined1 auStack_4a2 [2];
  code *pcStack_4a0;
  undefined8 uStack_498;
  long lStack_488;
  void *pvStack_480;
  long lStack_478;
  undefined1 auStack_408 [16];
  undefined1 auStack_3f8 [16];
  undefined8 uStack_3e0;
  uv_fs_t *puStack_3d8;
  uv_fs_t *puStack_3d0;
  undefined8 uStack_3c8;
  code *pcStack_3b8;
  code *pcStack_3b0;
  undefined8 uStack_3a8;
  undefined1 auStack_398 [16];
  undefined1 auStack_388 [16];
  undefined1 auStack_378 [16];
  undefined1 auStack_368 [16];
  undefined1 auStack_358 [256];
  undefined1 auStack_258 [256];
  undefined1 auStack_158 [128];
  undefined1 auStack_d8 [136];
  undefined1 *puStack_50;
  
  fs_file_open_append(in_EDI);
  fs_file_open_append(in_EDI);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_00157884:
    fs_file_open_append_cold_2();
LAB_00157889:
    fs_file_open_append_cold_3();
LAB_0015788e:
    fs_file_open_append_cold_4();
LAB_00157893:
    fs_file_open_append_cold_5();
LAB_00157898:
    fs_file_open_append_cold_6();
LAB_0015789d:
    fs_file_open_append_cold_7();
LAB_001578a2:
    fs_file_open_append_cold_8();
LAB_001578a7:
    fs_file_open_append_cold_9();
LAB_001578ac:
    fs_file_open_append_cold_10();
LAB_001578b1:
    fs_file_open_append_cold_11();
LAB_001578b6:
    fs_file_open_append_cold_12();
LAB_001578bb:
    fs_file_open_append_cold_13();
LAB_001578c0:
    fs_file_open_append_cold_14();
LAB_001578c5:
    fs_file_open_append_cold_15();
LAB_001578ca:
    fs_file_open_append_cold_16();
LAB_001578cf:
    fs_file_open_append_cold_17();
LAB_001578d4:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157884;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157889;
    if (write_req.result < 0) goto LAB_0015788e;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157893;
    if (close_req.result != 0) goto LAB_00157898;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar2 < 0) goto LAB_0015789d;
    if (open_req1.result._4_4_ < 0) goto LAB_001578a2;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_001578a7;
    if (write_req.result < 0) goto LAB_001578ac;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001578b1;
    if (close_req.result != 0) goto LAB_001578b6;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar2 < 0) goto LAB_001578bb;
    if (open_req1.result._4_4_ < 0) goto LAB_001578c0;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iov = uVar19;
    uVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_001578c5;
    if (read_req.result != 0x1a) goto LAB_001578ca;
    auVar18[0] = -(buf[10] == 'r');
    auVar18[1] = -(buf[0xb] == '\n');
    auVar18[2] = -(buf[0xc] == '\0');
    auVar18[3] = -(buf[0xd] == 't');
    auVar18[4] = -(buf[0xe] == 'e');
    auVar18[5] = -(buf[0xf] == 's');
    auVar18[6] = -(buf[0x10] == 't');
    auVar18[7] = -(buf[0x11] == '-');
    auVar18[8] = -(buf[0x12] == 'b');
    auVar18[9] = -(buf[0x13] == 'u');
    auVar18[10] = -(buf[0x14] == 'f');
    auVar18[0xb] = -(buf[0x15] == 'f');
    auVar18[0xc] = -(buf[0x16] == 'e');
    auVar18[0xd] = -(buf[0x17] == 'r');
    auVar18[0xe] = -(buf[0x18] == '\n');
    auVar18[0xf] = -(buf[0x19] == '\0');
    auVar17[0] = -(buf[0] == 't');
    auVar17[1] = -(buf[1] == 'e');
    auVar17[2] = -(buf[2] == 's');
    auVar17[3] = -(buf[3] == 't');
    auVar17[4] = -(buf[4] == '-');
    auVar17[5] = -(buf[5] == 'b');
    auVar17[6] = -(buf[6] == 'u');
    auVar17[7] = -(buf[7] == 'f');
    auVar17[8] = -(buf[8] == 'f');
    auVar17[9] = -(buf[9] == 'e');
    auVar17[10] = -(buf[10] == 'r');
    auVar17[0xb] = -(buf[0xb] == '\n');
    auVar17[0xc] = -(buf[0xc] == '\0');
    auVar17[0xd] = -(buf[0xd] == 't');
    auVar17[0xe] = -(buf[0xe] == 'e');
    auVar17[0xf] = -(buf[0xf] == 's');
    auVar17 = auVar17 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001578cf;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_001578d4;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  fs_file_open_append_cold_19();
  unlink("test_file");
  unlink("test_file2");
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00157c1f:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00157c24:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00157c29:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00157c2e:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00157c33:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00157c38:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00157c3d:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00157c42:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00157c47:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00157c4c:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00157c51:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00157c56:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00157c5b:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00157c60:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00157c65:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00157c6a:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00157c6f:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00157c74:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157c1f;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157c24;
    if (write_req.result < 0) goto LAB_00157c29;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c2e;
    if (close_req.result != 0) goto LAB_00157c33;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_00157c38;
    if (open_req1.result._4_4_ < 0) goto LAB_00157c3d;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c42;
    if (close_req.result != 0) goto LAB_00157c47;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_00157c4c;
    if (rename_req.result != 0) goto LAB_00157c51;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_00157c56;
    if (open_req1.result._4_4_ < 0) goto LAB_00157c5b;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00157c60;
    if (read_req.result < 0) goto LAB_00157c65;
    iVar4 = 0x2e3070;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00157c6a;
    uv_fs_req_cleanup();
    iVar4 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157c6f;
    if (close_req.result != 0) goto LAB_00157c74;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    iVar4 = uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar4);
  fs_read_bufs(iVar4);
  __s1 = (undefined1 *)uv_default_loop();
  uv_walk(__s1,close_walk_cb,0);
  uv_run(__s1,0);
  uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_3b0 = (code *)0x157ced;
  puStack_50 = __s1;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_3b0 = (code *)0x157f25;
    fs_read_bufs_cold_1();
LAB_00157f25:
    pcStack_3b0 = (code *)0x157f2a;
    fs_read_bufs_cold_2();
LAB_00157f2a:
    pcStack_3b0 = (code *)0x157f2f;
    fs_read_bufs_cold_3();
LAB_00157f2f:
    pcStack_3b0 = (code *)0x157f34;
    fs_read_bufs_cold_4();
LAB_00157f34:
    pcStack_3b0 = (code *)0x157f39;
    fs_read_bufs_cold_5();
LAB_00157f39:
    pcStack_3b0 = (code *)0x157f3e;
    fs_read_bufs_cold_6();
LAB_00157f3e:
    pcStack_3b0 = (code *)0x157f43;
    fs_read_bufs_cold_7();
LAB_00157f43:
    pcStack_3b0 = (code *)0x157f48;
    fs_read_bufs_cold_8();
LAB_00157f48:
    pcStack_3b0 = (code *)0x157f4d;
    fs_read_bufs_cold_9();
LAB_00157f4d:
    pcStack_3b0 = (code *)0x157f52;
    fs_read_bufs_cold_10();
LAB_00157f52:
    pcStack_3b0 = (code *)0x157f57;
    fs_read_bufs_cold_11();
LAB_00157f57:
    pcStack_3b0 = (code *)0x157f5c;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157f25;
    pcStack_3b0 = (code *)0x157d0f;
    uv_fs_req_cleanup();
    uStack_3a8 = 0;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157d33;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157f2a;
    uStack_3a8 = 0;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157d63;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157f2f;
    uStack_3a8 = 0;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157d93;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_398,0,0);
    if (iVar2 != -0x16) goto LAB_00157f34;
    pcStack_3b0 = (code *)0x157dab;
    auStack_398 = uv_buf_init(auStack_358,0x100);
    __s1 = auStack_398;
    pcStack_3b0 = (code *)0x157dc9;
    auStack_388 = uv_buf_init(auStack_258,0x100);
    pcStack_3b0 = (code *)0x157de3;
    auStack_378 = uv_buf_init(auStack_158,0x80);
    pcStack_3b0 = (code *)0x157dfd;
    auStack_368 = uv_buf_init(auStack_d8,0x80);
    uStack_3a8 = 0;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157e2d;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar2 != 0x1be) goto LAB_00157f39;
    if (read_req.result != 0x1be) goto LAB_00157f3e;
    __s1 = auStack_378;
    unaff_R14 = &read_req;
    pcStack_3b0 = (code *)0x157e5d;
    uv_fs_req_cleanup();
    uStack_3a8 = 0;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157e84;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157f43;
    if (read_req.result != 0xbe) goto LAB_00157f48;
    pcStack_3b0 = (code *)0x157eac;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_388._0_8_;
    pcStack_3b0 = (code *)0x157ec3;
    puVar12 = (undefined1 *)auStack_388._0_8_;
    iVar2 = bcmp((void *)auStack_388._0_8_,(void *)auStack_378._0_8_,0x80);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_00157f4d;
    __s1 = __s1 + 0x80;
    pcStack_3b0 = (code *)0x157ee1;
    puVar12 = __s1;
    iVar2 = bcmp(__s1,(void *)auStack_368._0_8_,0x3e);
    iVar4 = (int)puVar12;
    if (iVar2 != 0) goto LAB_00157f52;
    iVar4 = 0;
    pcStack_3b0 = (code *)0x157efb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157f57;
    if (close_req.result == 0) {
      pcStack_3b0 = (code *)0x157f15;
      iVar2 = uv_fs_req_cleanup(&close_req);
      return iVar2;
    }
  }
  pcStack_3b0 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_3b8 = (code *)0x157f67;
  pcStack_3b0 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_3b8 = (code *)0x157f6c;
  fs_read_file_eof(iVar4);
  pcStack_3b8 = (code *)0x157f71;
  uVar5 = uv_default_loop();
  pcStack_3b8 = (code *)0x157f85;
  uv_walk(uVar5,close_walk_cb,0);
  pcStack_3b8 = (code *)0x157f8f;
  uv_run(uVar5,0);
  pcStack_3b8 = (code *)0x157f94;
  uVar6 = uv_default_loop();
  pcStack_3b8 = (code *)0x157f9c;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_3b8 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar11 = (uv_fs_t *)0x184385;
  puStack_3d0 = (uv_fs_t *)0x157fbd;
  pcStack_3b8 = (code *)uVar5;
  unlink("test_file");
  puStack_3d0 = (uv_fs_t *)0x157fc2;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_3d0 = (uv_fs_t *)0x157fe8;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_3d0 = (uv_fs_t *)0x158245;
    fs_read_file_eof_cold_1();
LAB_00158245:
    puStack_3d0 = (uv_fs_t *)0x15824a;
    fs_read_file_eof_cold_2();
LAB_0015824a:
    puStack_3d0 = (uv_fs_t *)0x15824f;
    fs_read_file_eof_cold_3();
LAB_0015824f:
    puStack_3d0 = (uv_fs_t *)0x158254;
    fs_read_file_eof_cold_4();
LAB_00158254:
    puStack_3d0 = (uv_fs_t *)0x158259;
    fs_read_file_eof_cold_5();
LAB_00158259:
    puStack_3d0 = (uv_fs_t *)0x15825e;
    fs_read_file_eof_cold_6();
LAB_0015825e:
    puStack_3d0 = (uv_fs_t *)0x158263;
    fs_read_file_eof_cold_7();
LAB_00158263:
    puStack_3d0 = (uv_fs_t *)0x158268;
    fs_read_file_eof_cold_8();
LAB_00158268:
    puStack_3d0 = (uv_fs_t *)0x15826d;
    fs_read_file_eof_cold_9();
LAB_0015826d:
    puStack_3d0 = (uv_fs_t *)0x158272;
    fs_read_file_eof_cold_10();
LAB_00158272:
    puStack_3d0 = (uv_fs_t *)0x158277;
    fs_read_file_eof_cold_11();
LAB_00158277:
    puStack_3d0 = (uv_fs_t *)0x15827c;
    fs_read_file_eof_cold_12();
LAB_0015827c:
    puStack_3d0 = (uv_fs_t *)0x158281;
    fs_read_file_eof_cold_13();
LAB_00158281:
    puStack_3d0 = (uv_fs_t *)0x158286;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158245;
    puStack_3d0 = (uv_fs_t *)0x15800a;
    uv_fs_req_cleanup(&open_req1);
    puStack_3d0 = (uv_fs_t *)0x15801b;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3c8 = 0;
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x158059;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015824a;
    if (write_req.result < 0) goto LAB_0015824f;
    puStack_3d0 = (uv_fs_t *)0x15807b;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x158091;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158254;
    if (close_req.result != 0) goto LAB_00158259;
    puStack_3d0 = (uv_fs_t *)0x1580b3;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x1580d0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_0015825e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158263;
    puStack_3d0 = (uv_fs_t *)0x1580f2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3d0 = (uv_fs_t *)0x158114;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c8 = 0;
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x158152;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158268;
    if (read_req.result < 0) goto LAB_0015826d;
    iVar4 = 0x2e3070;
    puStack_3d0 = (uv_fs_t *)0x15817b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158272;
    puVar11 = &read_req;
    puStack_3d0 = (uv_fs_t *)0x158192;
    uv_fs_req_cleanup(&read_req);
    puStack_3d0 = (uv_fs_t *)0x1581a3;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_3c8 = 0;
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x1581dd;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_00158277;
    if (read_req.result != 0) goto LAB_0015827c;
    puStack_3d0 = (uv_fs_t *)0x1581ff;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_3d0 = (uv_fs_t *)0x158215;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158281;
    if (close_req.result == 0) {
      puStack_3d0 = (uv_fs_t *)0x15822f;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_3d0 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3d8 = (uv_fs_t *)0x158291;
  puStack_3d0 = puVar11;
  fs_write_multiple_bufs(iVar4);
  puStack_3d8 = (uv_fs_t *)0x158296;
  fs_write_multiple_bufs(iVar4);
  puStack_3d8 = (uv_fs_t *)0x15829b;
  uVar5 = uv_default_loop();
  puStack_3d8 = (uv_fs_t *)0x1582af;
  uv_walk(uVar5,close_walk_cb,0);
  puStack_3d8 = (uv_fs_t *)0x1582b9;
  uv_run(uVar5,0);
  puStack_3d8 = (uv_fs_t *)0x1582be;
  uVar6 = uv_default_loop();
  puStack_3d8 = (uv_fs_t *)0x1582c6;
  iVar2 = uv_loop_close(uVar6);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_3d8 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_3e0 = uVar5;
  puStack_3d8 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00158766:
    fs_write_multiple_bufs_cold_2();
LAB_0015876b:
    fs_write_multiple_bufs_cold_3();
LAB_00158770:
    fs_write_multiple_bufs_cold_4();
LAB_00158775:
    fs_write_multiple_bufs_cold_5();
LAB_0015877a:
    fs_write_multiple_bufs_cold_6();
LAB_0015877f:
    fs_write_multiple_bufs_cold_7();
LAB_00158784:
    fs_write_multiple_bufs_cold_8();
LAB_00158789:
    fs_write_multiple_bufs_cold_9();
LAB_0015878e:
    fs_write_multiple_bufs_cold_10();
LAB_00158793:
    fs_write_multiple_bufs_cold_11();
LAB_00158798:
    fs_write_multiple_bufs_cold_12();
LAB_0015879d:
    fs_write_multiple_bufs_cold_13();
LAB_001587a2:
    fs_write_multiple_bufs_cold_14();
LAB_001587a7:
    fs_write_multiple_bufs_cold_15();
LAB_001587ac:
    fs_write_multiple_bufs_cold_16();
LAB_001587b1:
    fs_write_multiple_bufs_cold_19();
LAB_001587b6:
    fs_write_multiple_bufs_cold_20();
LAB_001587bb:
    fs_write_multiple_bufs_cold_21();
LAB_001587c0:
    fs_write_multiple_bufs_cold_22();
LAB_001587c5:
    fs_write_multiple_bufs_cold_23();
LAB_001587ca:
    fs_write_multiple_bufs_cold_24();
LAB_001587cf:
    fs_write_multiple_bufs_cold_25();
LAB_001587d4:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158766;
    uv_fs_req_cleanup(&open_req1);
    auStack_408 = uv_buf_init(test_buf,0xd);
    auStack_3f8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_408,2,0);
    if (iVar4 < 0) goto LAB_0015876b;
    if (write_req.result < 0) goto LAB_00158770;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158775;
    if (close_req.result != 0) goto LAB_0015877a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_0015877f;
    if (open_req1.result._4_4_ < 0) goto LAB_00158784;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar17 = uv_buf_init(buf,0xd);
    auStack_408 = auVar17;
    auVar17 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_3f8 = auVar17;
    _Var7 = lseek64((int)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_00158789;
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_408,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_0015878e;
    if (read_req.result != 0x1c) goto LAB_00158793;
    iVar2 = 0x2e3070;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00158798;
    iVar2 = 0x2e4460;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_0015879d;
    uv_fs_req_cleanup(&read_req);
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_001587a2;
    if (read_req.result != 0) goto LAB_001587a7;
    uv_fs_req_cleanup(&read_req);
    auVar17 = uv_buf_init(buf,0xd);
    auStack_408 = auVar17;
    auVar17 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_3f8 = auVar17;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_408,2,0);
    if (iVar4 < 0) goto LAB_001587ac;
    if (read_req.result == 0x1c) {
LAB_00158664:
      iVar2 = 0x2e3070;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_001587b1;
      iVar2 = 0x2e4460;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_001587b6;
      uv_fs_req_cleanup(&read_req);
      uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar19;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_001587bb;
      if (read_req.result != 0) goto LAB_001587c0;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_001587c5;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_001587ca;
    }
    if (read_req.result != 0xd) goto LAB_001587cf;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3f8,1,read_req.result);
    if (iVar4 < 0) goto LAB_001587d4;
    if (read_req.result == 0xf) goto LAB_00158664;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00158b56:
    fs_write_alotof_bufs_cold_18();
LAB_00158b5b:
    fs_write_alotof_bufs_cold_1();
LAB_00158b60:
    fs_write_alotof_bufs_cold_2();
LAB_00158b65:
    fs_write_alotof_bufs_cold_3();
LAB_00158b6a:
    fs_write_alotof_bufs_cold_4();
LAB_00158b6f:
    fs_write_alotof_bufs_cold_17();
LAB_00158b74:
    fs_write_alotof_bufs_cold_5();
LAB_00158b79:
    fs_write_alotof_bufs_cold_6();
LAB_00158b7e:
    fs_write_alotof_bufs_cold_7();
LAB_00158b83:
    fs_write_alotof_bufs_cold_8();
LAB_00158b88:
    fs_write_alotof_bufs_cold_9();
LAB_00158b8d:
    fs_write_alotof_bufs_cold_10();
LAB_00158b92:
    fs_write_alotof_bufs_cold_12();
LAB_00158b97:
    fs_write_alotof_bufs_cold_13();
LAB_00158b9c:
    fs_write_alotof_bufs_cold_14();
LAB_00158ba1:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00158b5b;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b60;
    uv_fs_req_cleanup(&open_req1);
    lVar15 = 8;
    do {
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158b65;
    if (write_req.result != 0xac67d) goto LAB_00158b6a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar9 = malloc(0xac67d);
    if (pvVar9 == (void *)0x0) goto LAB_00158b6f;
    lVar15 = 8;
    pvVar16 = pvVar9;
    do {
      auVar17 = uv_buf_init(pvVar16,0xd);
      *(long *)((long)pvVar8 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
      pvVar16 = (void *)((long)pvVar16 + 0xd);
    } while (lVar15 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00158b74;
    if (close_req.result != 0) goto LAB_00158b79;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158b7e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b83;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158b88;
    if (read_req.result != 0x3400) goto LAB_00158b8d;
    unaff_R12 = 0;
    do {
      pcVar10 = (char *)((long)pvVar9 + unaff_R12);
      iVar4 = strncmp(pcVar10,test_buf,0xd);
      iVar2 = (int)pcVar10;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158b56;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar9);
    iVar2 = (int)open_req1.result;
    _Var7 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00158b92;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158b97;
    if (read_req.result != 0) goto LAB_00158b9c;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158ba1;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar8);
      return extraout_EAX;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar8 = (void *)uv_default_loop();
  uv_walk(pvVar8,close_walk_cb,0);
  uv_run(pvVar8,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_4a0 = (code *)0x158c0d;
  pvStack_480 = pvVar8;
  lStack_478 = unaff_R12;
  unlink("test_file");
  pcStack_4a0 = (code *)0x158c12;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_4a0 = (code *)0x158c23;
  pvVar9 = malloc(0xd4310);
  if (pvVar9 == (void *)0x0) {
LAB_00158f6f:
    pvVar9 = pvVar8;
    pcStack_4a0 = (code *)0x158f74;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158f74:
    pcStack_4a0 = (code *)0x158f79;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158f79:
    pcStack_4a0 = (code *)0x158f7e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158f7e:
    pcStack_4a0 = (code *)0x158f83;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158f83:
    pcStack_4a0 = (code *)0x158f88;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158f88:
    pcStack_4a0 = (code *)0x158f8d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158f8d:
    pcStack_4a0 = (code *)0x158f92;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158f92:
    pcStack_4a0 = (code *)0x158f97;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158f97:
    pcStack_4a0 = (code *)0x158f9c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158f9c:
    pcStack_4a0 = (code *)0x158fa1;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158fa1:
    pcStack_4a0 = (code *)0x158fa6;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158fa6:
    pcStack_4a0 = (code *)0x158fab;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158fab:
    pcStack_4a0 = (code *)0x158fb0;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158fb0:
    pcStack_4a0 = (code *)0x158fb5;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158fb5:
    pcStack_4a0 = (code *)0x158fba;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_4a0 = (code *)0x158c52;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158f74;
    if (open_req1.result._4_4_ < 0) goto LAB_00158f79;
    pcStack_4a0 = (code *)0x158c74;
    uv_fs_req_cleanup(&open_req1);
    pcStack_4a0 = (code *)0x158c85;
    uVar19 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_498 = 0;
    pcStack_4a0 = (code *)0x158cc3;
    iov = uVar19;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158f7e;
    if (write_req.result != 10) goto LAB_00158f83;
    pcStack_4a0 = (code *)0x158ce8;
    uv_fs_req_cleanup(&write_req);
    lVar15 = 8;
    do {
      pcStack_4a0 = (code *)0x158d02;
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar9 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0xd4318);
    uStack_498 = 0;
    pcStack_4a0 = (code *)0x158d43;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f88;
    if (write_req.result != 0xac67d) goto LAB_00158f8d;
    pcStack_4a0 = (code *)0x158d68;
    uv_fs_req_cleanup(&write_req);
    pcStack_4a0 = (code *)0x158d72;
    pcVar10 = (char *)malloc(0xac67d);
    if (pcVar10 == (char *)0x0) goto LAB_00158f92;
    lVar15 = 8;
    pcVar13 = pcVar10;
    do {
      pcStack_4a0 = (code *)0x158d94;
      auVar17 = uv_buf_init(pcVar13,0xd);
      *(long *)((long)pvVar9 + lVar15 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar9 + lVar15) = auVar17._8_8_;
      lVar15 = lVar15 + 0x10;
      pcVar13 = pcVar13 + 0xd;
    } while (lVar15 != 0xd4318);
    uStack_498 = 0;
    pcStack_4a0 = (code *)0x158dd6;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar9,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f97;
    lStack_488 = 10;
    lVar15 = 0xd;
    if (iVar2 != 0xd) {
      lVar15 = 0x3400;
    }
    if (read_req.result != lVar15) goto LAB_00158f9c;
    pcVar13 = pcVar10;
    uVar14 = 0;
    do {
      pcStack_4a0 = (code *)0x158e20;
      iVar4 = strncmp(pcVar13,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_4a0 = (code *)0x158f6f;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar8 = pvVar9;
        goto LAB_00158f6f;
      }
      if (iVar2 == 0xd) break;
      pcVar13 = pcVar13 + 0xd;
      bVar1 = uVar14 < 0x3ff;
      uVar14 = uVar14 + 1;
    } while (bVar1);
    pcStack_4a0 = (code *)0x158e4d;
    uv_fs_req_cleanup(&read_req);
    pcStack_4a0 = (code *)0x158e55;
    free(pcVar10);
    pcStack_4a0 = (code *)0x158e6c;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar15 = lStack_488;
    if (iVar2 != 0) goto LAB_00158fa1;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_488) goto LAB_00158fa6;
    pcStack_4a0 = (code *)0x158ea0;
    uv_fs_req_cleanup(&stat_req);
    pcStack_4a0 = (code *)0x158eb1;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_498 = 0;
    pcStack_4a0 = (code *)0x158ef2;
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar15 + write_req.result);
    if (iVar2 != 0) goto LAB_00158fab;
    if (read_req.result != 0) goto LAB_00158fb0;
    pcStack_4a0 = (code *)0x158f14;
    uv_fs_req_cleanup(&read_req);
    pcStack_4a0 = (code *)0x158f2a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158fb5;
    if (close_req.result == 0) {
      pcStack_4a0 = (code *)0x158f48;
      uv_fs_req_cleanup(&close_req);
      pcStack_4a0 = (code *)0x158f54;
      unlink("test_file");
      free(pvVar9);
      return extraout_EAX_00;
    }
  }
  pcStack_4a0 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_4a0 = (code *)pvVar9;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00159131;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159136;
    uv_fs_req_cleanup(&open_req1);
    uVar19 = (uv_buf_t)uv_buf_init(auStack_4a2,2);
    iov = uVar19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_0015913b;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00159145;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00159131:
    run_test_fs_read_dir_cold_2();
LAB_00159136:
    run_test_fs_read_dir_cold_3();
LAB_0015913b:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159145:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_open_append) {
  fs_file_open_append(0);
  fs_file_open_append(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}